

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O2

unordered_set<std::shared_ptr<kratos::Port>,_std::hash<std::shared_ptr<kratos::Port>_>,_std::equal_to<std::shared_ptr<kratos::Port>_>,_std::allocator<std::shared_ptr<kratos::Port>_>_>
* __thiscall
kratos::Port::connected_to
          (unordered_set<std::shared_ptr<kratos::Port>,_std::hash<std::shared_ptr<kratos::Port>_>,_std::equal_to<std::shared_ptr<kratos::Port>_>,_std::allocator<std::shared_ptr<kratos::Port>_>_>
           *__return_storage_ptr__,Port *this)

{
  __node_base *p_Var1;
  size_type *psVar2;
  undefined1 local_b8 [8];
  PortVisitor v;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  if (this->direction_ != In) {
    p_Var1 = &(this->super_Var).sinks_._M_h._M_before_begin;
    v.ports._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_002aea20;
    while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
      v.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
      v.super_IRVisitor._8_8_ = &v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
      v.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
      v.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
      v.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      v.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
      v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      v.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
      v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
      local_b8 = (undefined1  [8])v.ports._M_h._M_single_bucket;
      v.super_IRVisitor.visited_._M_h._M_single_bucket =
           (__node_base_ptr)&v.ports._M_h._M_rehash_policy._M_next_resize;
      v.ports._M_h._M_buckets = (__buckets_ptr)0x1;
      v.ports._M_h._M_bucket_count = 0;
      v.ports._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      v.ports._M_h._M_element_count._0_4_ = 0x3f800000;
      v.ports._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      v.ports._M_h._M_rehash_policy._4_4_ = 0;
      v.ports._M_h._M_rehash_policy._M_next_resize = 0;
      IRVisitor::visit_root((IRVisitor *)local_b8,(IRNode *)p_Var1[1]._M_nxt[0x18]._M_nxt);
      psVar2 = &v.ports._M_h._M_bucket_count;
      while (psVar2 = (size_type *)*psVar2, psVar2 != (size_type *)0x0) {
        if ((*(int *)&((__node_base *)(psVar2 + 1))->_M_nxt[0x4e]._M_nxt == 0) &&
           ((Generator *)((__node_base *)(psVar2 + 1))->_M_nxt[0x40]._M_nxt !=
            (this->super_Var).generator_)) {
          std::
          _Hashtable<std::shared_ptr<kratos::Port>,std::shared_ptr<kratos::Port>,std::allocator<std::shared_ptr<kratos::Port>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Port>>,std::hash<std::shared_ptr<kratos::Port>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<std::shared_ptr<kratos::Port>const&>
                    ((_Hashtable<std::shared_ptr<kratos::Port>,std::shared_ptr<kratos::Port>,std::allocator<std::shared_ptr<kratos::Port>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Port>>,std::hash<std::shared_ptr<kratos::Port>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)__return_storage_ptr__,(__node_base *)(psVar2 + 1));
        }
      }
      PortVisitor::~PortVisitor((PortVisitor *)local_b8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<std::shared_ptr<Port>> Port::connected_to() const {
    std::unordered_set<std::shared_ptr<Port>> result;
    if (direction_ == PortDirection::In) return result;
    for (auto const& stmt : sinks_) {
        auto* const sinks = stmt->left();
        PortVisitor v;
        v.visit_root(sinks);
        auto const& ports = v.ports;
        for (auto const& p : ports) {
            if (p->direction_ == PortDirection::In && p->generator_ != generator_) {
                result.emplace(p);
            }
        }
    }
    return result;
}